

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::SumState<long>,long,duckdb::IntegerSumOperation>
               (long *idata,AggregateInputData *aggr_input_data,SumState<long> *state,idx_t count,
               ValidityMask *mask,SelectionVector *sel_vector)

{
  bool bVar1;
  SumState<long> *in_RCX;
  AggregateInputData *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateUnaryInput input;
  long *in_stack_ffffffffffffffa8;
  SumState<long> *pSVar2;
  SumState<long> *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  
  AggregateUnaryInput::AggregateUnaryInput
            ((AggregateUnaryInput *)&stack0xffffffffffffffb8,in_RSI,(ValidityMask *)in_R8);
  bVar1 = BaseSumOperation<duckdb::SumSetOperation,_duckdb::RegularAdd>::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8), bVar1)) {
    for (pSVar2 = (SumState<long> *)0x0; pSVar2 < in_RCX;
        pSVar2 = (SumState<long> *)&pSVar2->field_0x1) {
      SelectionVector::get_index(in_R9,(idx_t)pSVar2);
      BaseSumOperation<duckdb::SumSetOperation,duckdb::RegularAdd>::
      Operation<long,duckdb::SumState<long>,duckdb::IntegerSumOperation>
                (in_stack_ffffffffffffffb0,(long *)pSVar2,(AggregateUnaryInput *)0x8610ba);
    }
  }
  else {
    for (pSVar2 = (SumState<long> *)0x0; pSVar2 < in_RCX;
        pSVar2 = (SumState<long> *)&pSVar2->field_0x1) {
      SelectionVector::get_index(in_R9,(idx_t)pSVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffffb8,(idx_t)pSVar2);
      if (bVar1) {
        BaseSumOperation<duckdb::SumSetOperation,duckdb::RegularAdd>::
        Operation<long,duckdb::SumState<long>,duckdb::IntegerSumOperation>
                  (pSVar2,in_stack_ffffffffffffffa8,(AggregateUnaryInput *)0x861060);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}